

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int r1fgkb_(int *ido,int *ip,int *l1,int *idl1,double *cc,double *c1,double *c2,int *in1,double *ch,
           double *ch2,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  double *pdVar32;
  double *pdVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  double *pdVar41;
  int iVar42;
  ulong uVar43;
  long lVar44;
  double *pdVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  ulong uVar50;
  int iVar51;
  double *pdVar52;
  long lVar53;
  long lVar54;
  int iVar55;
  long lVar56;
  long lVar57;
  int iVar58;
  long lVar59;
  long lVar60;
  double *pdVar61;
  long lVar62;
  int iVar63;
  int iVar64;
  long lVar65;
  double *pdVar66;
  double *pdVar67;
  int iVar68;
  long lVar69;
  bool bVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double *local_1d8;
  double *local_1c8;
  int local_1c0;
  double *local_1b8;
  double *local_108;
  int local_c4;
  double *local_b0;
  
  iVar30 = *in1;
  lVar29 = (long)iVar30;
  iVar19 = *idl1;
  lVar7 = (long)iVar19;
  iVar1 = *ido;
  lVar65 = (long)iVar1;
  iVar24 = *l1;
  lVar20 = (long)iVar24;
  iVar16 = (iVar24 + 1) * iVar1 + 1;
  lVar25 = (long)~(iVar16 * iVar30);
  iVar46 = *ip;
  lVar59 = (long)iVar46;
  lVar69 = (long)(~((iVar46 + 1) * iVar1) * iVar30 + -1);
  iVar2 = *in2;
  lVar56 = (long)iVar2;
  lVar8 = (long)~((iVar19 + 1) * iVar2);
  lVar21 = (long)~(iVar16 * iVar2);
  pdVar14 = cc + lVar69;
  dVar71 = cos(6.283185307179586 / (double)iVar46);
  dVar72 = sin(6.283185307179586 / (double)iVar46);
  iVar16 = *ido;
  lVar34 = (long)iVar16;
  iVar4 = (iVar16 + -1) / 2;
  iVar47 = *ip;
  lVar9 = (long)iVar47;
  local_1c0 = (iVar47 + 1) / 2;
  uVar3 = *l1;
  if (iVar16 < (int)uVar3) {
    uVar43 = 0;
    if (0 < (int)uVar3) {
      uVar43 = (ulong)uVar3;
    }
    uVar10 = (ulong)((int)uVar43 + 1);
    iVar18 = 0;
    if (0 < iVar16) {
      iVar18 = iVar16;
    }
    pdVar12 = cc + ((lVar59 + 1) * lVar65 + 1) * lVar29 + lVar69 + 1;
    pdVar41 = ch + ((lVar20 + 1) * lVar65 + 1) * lVar56 + lVar21 + 1;
    for (uVar35 = 1; uVar50 = uVar43, pdVar11 = pdVar41, pdVar33 = pdVar12, uVar35 != iVar18 + 1;
        uVar35 = uVar35 + 1) {
      while (uVar50 != 0) {
        *pdVar11 = *pdVar33;
        uVar50 = uVar50 - 1;
        pdVar11 = pdVar11 + lVar65 * lVar56;
        pdVar33 = pdVar33 + lVar59 * lVar65 * lVar29;
      }
      pdVar12 = pdVar12 + lVar29;
      pdVar41 = pdVar41 + lVar56;
    }
  }
  else {
    uVar43 = 1;
    uVar5 = 0;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    uVar10 = (ulong)(uVar5 + 1);
    pdVar12 = cc + ((lVar59 + 1) * lVar65 + 1) * lVar29 + lVar69 + 1;
    pdVar41 = ch + ((lVar20 + 1) * lVar65 + 1) * lVar56 + lVar21 + 1;
    for (; pdVar11 = pdVar12, pdVar33 = pdVar41, uVar35 = (ulong)(iVar16 + 1), uVar43 != uVar10;
        uVar43 = uVar43 + 1) {
      while (uVar35 - 1 != 0) {
        *pdVar33 = *pdVar11;
        pdVar11 = pdVar11 + lVar29;
        pdVar33 = pdVar33 + lVar56;
        uVar35 = uVar35 - 1;
      }
      pdVar12 = pdVar12 + lVar59 * lVar65 * lVar29;
      pdVar41 = pdVar41 + lVar65 * lVar56;
    }
  }
  lVar26 = (long)~((iVar19 + 1) * iVar30);
  pdVar11 = cc + ((lVar59 + 3) * lVar65 + 1) * lVar29 + 1;
  lVar27 = lVar65 * lVar29;
  pdVar33 = cc + ((lVar59 + 2) * lVar65 + lVar34) * lVar29 + 1;
  lVar36 = (lVar20 * 2 + 1) * lVar65;
  lVar37 = lVar56 * (lVar36 + 1);
  lVar38 = lVar65 * lVar56;
  lVar60 = lVar38 * lVar20;
  lVar39 = lVar38 * 8;
  lVar49 = (long)(iVar47 + 2) + -2;
  lVar54 = (lVar20 * lVar49 + 1) * lVar65;
  lVar40 = lVar56 * (lVar54 + 1);
  lVar31 = (long)local_1c0;
  pdVar12 = ch + lVar37 + lVar21;
  pdVar41 = ch + lVar40 + lVar21;
  for (lVar57 = 2; lVar44 = 8, pdVar13 = pdVar33, pdVar15 = pdVar11, uVar43 = uVar10,
      lVar57 <= lVar31; lVar57 = lVar57 + 1) {
    while (uVar43 - 1 != 0) {
      *(double *)((long)pdVar12 + lVar44) = pdVar13[lVar69] + pdVar13[lVar69];
      *(double *)((long)pdVar41 + lVar44) = pdVar15[lVar69] + pdVar15[lVar69];
      lVar44 = lVar44 + lVar39;
      pdVar13 = pdVar13 + lVar27 * lVar59;
      pdVar15 = pdVar15 + lVar27 * lVar59;
      uVar43 = uVar43 - 1;
    }
    pdVar11 = pdVar11 + lVar27 * 2;
    pdVar33 = pdVar33 + lVar27 * 2;
    pdVar12 = pdVar12 + lVar60;
    pdVar41 = pdVar41 + -lVar60;
  }
  if (iVar16 != 1) {
    if (iVar4 < (int)uVar3) {
      iVar6 = (iVar46 + 2) * iVar1;
      iVar18 = (iVar16 + iVar6 + -2) * iVar30;
      iVar42 = iVar30 * iVar1 * 2;
      iVar6 = (iVar16 + iVar6 + -1) * iVar30;
      iVar63 = (iVar46 + 3) * iVar1;
      iVar51 = (iVar63 + 3) * iVar30;
      iVar63 = (iVar63 + 2) * iVar30;
      pdVar33 = ch + (lVar36 + 3) * lVar56 + lVar21 + 1;
      pdVar11 = ch + (lVar36 + 2) * lVar56 + lVar21 + 1;
      pdVar41 = ch + (lVar54 + 3) * lVar56 + lVar21 + 1;
      pdVar12 = ch + (lVar54 + 2) * lVar56 + lVar21 + 1;
      for (lVar59 = 2; lVar59 <= lVar31; lVar59 = lVar59 + 1) {
        pdVar13 = pdVar11;
        pdVar15 = pdVar33;
        pdVar23 = pdVar12;
        pdVar67 = pdVar41;
        iVar64 = iVar18;
        iVar17 = iVar51;
        iVar55 = iVar6;
        iVar68 = iVar63;
        for (lVar69 = 3; lVar69 <= lVar34; lVar69 = lVar69 + 2) {
          lVar57 = 0;
          iVar58 = 0;
          uVar43 = uVar10;
          while (uVar43 = uVar43 - 1, uVar43 != 0) {
            *(double *)((long)pdVar13 + lVar57) =
                 pdVar14[(long)(iVar68 + iVar58) + 1] + pdVar14[(long)(iVar64 + iVar58) + 1];
            *(double *)((long)pdVar23 + lVar57) =
                 pdVar14[(long)(iVar68 + iVar58) + 1] - pdVar14[(long)(iVar64 + iVar58) + 1];
            *(double *)((long)pdVar15 + lVar57) =
                 pdVar14[(long)(iVar17 + iVar58) + 1] - pdVar14[(long)(iVar55 + iVar58) + 1];
            *(double *)((long)pdVar67 + lVar57) =
                 pdVar14[(long)(iVar17 + iVar58) + 1] + pdVar14[(long)(iVar55 + iVar58) + 1];
            iVar58 = iVar58 + iVar30 * iVar1 * iVar46;
            lVar57 = lVar57 + lVar39;
          }
          iVar64 = iVar64 + iVar30 * -2;
          iVar55 = iVar55 + iVar30 * -2;
          iVar17 = iVar17 + iVar30 * 2;
          iVar68 = iVar68 + iVar30 * 2;
          pdVar15 = pdVar15 + lVar56 * 2;
          pdVar13 = pdVar13 + lVar56 * 2;
          pdVar67 = pdVar67 + lVar56 * 2;
          pdVar23 = pdVar23 + lVar56 * 2;
        }
        iVar18 = iVar18 + iVar42;
        iVar6 = iVar6 + iVar42;
        iVar51 = iVar51 + iVar42;
        iVar63 = iVar63 + iVar42;
        pdVar33 = pdVar33 + lVar60;
        pdVar11 = pdVar11 + lVar60;
        pdVar41 = pdVar41 + -lVar60;
        pdVar12 = pdVar12 + -lVar60;
      }
    }
    else {
      iVar18 = (iVar46 + 3) * iVar1;
      local_108 = ch + (lVar36 + 2) * lVar56 + lVar21 + 1;
      local_b0 = ch + (lVar54 + 2) * lVar56 + lVar21 + 1;
      iVar42 = (iVar46 + 2) * iVar1;
      local_c4 = (iVar42 + iVar16 + -2) * iVar30;
      pdVar41 = ch + (lVar36 + 3) * lVar56 + lVar21 + 1;
      pdVar12 = ch + (lVar54 + 3) * lVar56 + lVar21 + 1;
      lVar59 = lVar29 * 8;
      for (lVar57 = 2; lVar57 <= lVar31; lVar57 = lVar57 + 1) {
        pdVar11 = local_108;
        pdVar33 = local_b0;
        pdVar13 = pdVar12;
        pdVar15 = pdVar41;
        iVar6 = local_c4;
        iVar51 = iVar18;
        iVar63 = iVar42;
        for (uVar43 = 1; uVar43 != uVar10; uVar43 = uVar43 + 1) {
          lVar62 = ((long)iVar51 + 2) * lVar59;
          pdVar67 = (double *)
                    ((long)cc + ((long)iVar63 + (long)(iVar16 + 2) + -3) * lVar59 + lVar69 * 8 + 8);
          lVar53 = ((long)iVar51 + 3) * lVar59;
          lVar48 = 0;
          pdVar23 = pdVar14;
          iVar55 = iVar6;
          for (lVar44 = 3; lVar44 <= lVar34; lVar44 = lVar44 + 2) {
            *(double *)((long)pdVar11 + lVar48) =
                 *(double *)((long)pdVar23 + lVar62 + 8) + pdVar14[(long)iVar55 + 1];
            *(double *)((long)pdVar33 + lVar48) =
                 *(double *)((long)pdVar23 + lVar62 + 8) - pdVar14[(long)iVar55 + 1];
            *(double *)((long)pdVar15 + lVar48) = *(double *)((long)pdVar23 + lVar53 + 8) - *pdVar67
            ;
            *(double *)((long)pdVar13 + lVar48) = *(double *)((long)pdVar23 + lVar53 + 8) + *pdVar67
            ;
            pdVar23 = pdVar23 + lVar29 * 2;
            lVar48 = lVar48 + lVar56 * 0x10;
            iVar55 = iVar55 + iVar30 * -2;
            pdVar67 = pdVar67 + lVar29 * -2;
          }
          iVar51 = iVar51 + iVar1 * iVar46;
          pdVar11 = pdVar11 + lVar38;
          pdVar33 = pdVar33 + lVar38;
          iVar6 = iVar6 + iVar30 * iVar1 * iVar46;
          iVar63 = iVar63 + iVar1 * iVar46;
          pdVar15 = pdVar15 + lVar38;
          pdVar13 = pdVar13 + lVar38;
        }
        iVar18 = iVar18 + iVar1 * 2;
        local_108 = local_108 + lVar60;
        local_b0 = local_b0 + -lVar60;
        local_c4 = local_c4 + iVar30 * iVar1 * 2;
        iVar42 = iVar42 + iVar1 * 2;
        pdVar41 = pdVar41 + lVar60;
        pdVar12 = pdVar12 + -lVar60;
      }
    }
  }
  lVar60 = lVar56 * (lVar7 + 1);
  lVar59 = lVar7 * 2 + 1;
  pdVar14 = c2 + lVar29 * lVar59 + lVar26;
  pdVar12 = c2 + (lVar49 * lVar7 + 1) * lVar29 + lVar26;
  lVar57 = lVar56 * lVar7;
  dVar73 = 1.0;
  dVar74 = 0.0;
  lVar49 = 8;
  for (lVar69 = 2; lVar69 <= lVar31; lVar69 = lVar69 + 1) {
    dVar75 = dVar72 * dVar73;
    uVar43 = (ulong)(uint)*idl1;
    if (*idl1 < 1) {
      uVar43 = 0;
    }
    dVar73 = dVar73 * dVar71 + -dVar72 * dVar74;
    dVar74 = dVar74 * dVar71 + dVar75;
    pdVar41 = ch2 + ((long)(iVar47 * iVar19) + 1) * lVar56 + 1;
    lVar44 = lVar49;
    pdVar11 = ch2 + ((long)(iVar19 * 2) + 1) * lVar56 + 1;
    pdVar33 = ch2 + lVar60 + 1;
    uVar35 = uVar43;
    while (bVar70 = uVar35 != 0, uVar35 = uVar35 - 1, bVar70) {
      *(double *)((long)pdVar14 + lVar44) = pdVar11[lVar8] * dVar73 + pdVar33[lVar8];
      *(double *)((long)pdVar12 + lVar44) = pdVar41[lVar8] * dVar74;
      pdVar33 = pdVar33 + lVar56;
      pdVar11 = pdVar11 + lVar56;
      lVar44 = lVar44 + lVar29 * 8;
      pdVar41 = pdVar41 + lVar56;
    }
    pdVar41 = ch2 + (((long)(iVar47 + 2) + -3) * lVar7 + 1) * lVar56 + lVar8;
    pdVar11 = ch2 + (lVar7 * 3 + 1) * lVar56 + lVar8;
    dVar75 = dVar73;
    dVar76 = dVar74;
    for (uVar35 = 3; uVar35 != local_1c0 + 1; uVar35 = uVar35 + 1) {
      dVar77 = dVar74 * dVar75;
      dVar75 = dVar75 * dVar73 + -dVar74 * dVar76;
      dVar76 = dVar76 * dVar73 + dVar77;
      lVar44 = lVar49;
      lVar48 = lVar49;
      uVar50 = uVar43;
      while (bVar70 = uVar50 != 0, uVar50 = uVar50 - 1, bVar70) {
        *(double *)((long)pdVar14 + lVar44) =
             *(double *)((long)pdVar11 + lVar48) * dVar75 + *(double *)((long)pdVar14 + lVar44);
        *(double *)((long)pdVar12 + lVar44) =
             *(double *)((long)pdVar41 + lVar48) * dVar76 + *(double *)((long)pdVar12 + lVar44);
        lVar48 = lVar48 + lVar56 * 8;
        lVar44 = lVar44 + lVar29 * 8;
      }
      pdVar11 = pdVar11 + lVar57;
      pdVar41 = pdVar41 + -lVar57;
    }
    pdVar14 = pdVar14 + lVar29 * lVar7;
    pdVar12 = pdVar12 + -(lVar29 * lVar7);
  }
  lVar59 = lVar59 * lVar56 * 8 + 8;
  for (lVar69 = 2; lVar69 <= lVar31; lVar69 = lVar69 + 1) {
    uVar5 = *idl1;
    if (*idl1 < 1) {
      uVar5 = 0;
    }
    uVar43 = (ulong)uVar5;
    pdVar14 = ch2 + lVar8;
    while (bVar70 = uVar43 != 0, uVar43 = uVar43 - 1, bVar70) {
      pdVar14[lVar60 + 1] = *(double *)((long)pdVar14 + lVar59) + pdVar14[lVar60 + 1];
      pdVar14 = pdVar14 + lVar56;
    }
    lVar59 = lVar59 + lVar57 * 8;
  }
  pdVar14 = ch + lVar37 + lVar21;
  lVar20 = lVar20 * lVar65;
  lVar49 = lVar20 * lVar56;
  lVar69 = (lVar36 + 1) * lVar29;
  pdVar12 = c1 + lVar69 + lVar25;
  lVar57 = lVar20 * lVar29;
  lVar59 = lVar27 * 8;
  pdVar11 = ch + lVar40 + lVar21;
  pdVar41 = c1 + (lVar54 + 1) * lVar29 + lVar25;
  for (lVar65 = 2; lVar40 = 8, lVar44 = 8, uVar43 = uVar10, lVar65 <= lVar31; lVar65 = lVar65 + 1) {
    while (uVar43 - 1 != 0) {
      *(double *)((long)pdVar14 + lVar44) =
           *(double *)((long)pdVar12 + lVar40) - *(double *)((long)pdVar41 + lVar40);
      *(double *)((long)pdVar11 + lVar44) =
           *(double *)((long)pdVar12 + lVar40) + *(double *)((long)pdVar41 + lVar40);
      lVar40 = lVar40 + lVar59;
      lVar44 = lVar44 + lVar39;
      uVar43 = uVar43 - 1;
    }
    pdVar14 = pdVar14 + lVar49;
    pdVar12 = pdVar12 + lVar57;
    pdVar11 = pdVar11 + -lVar49;
    pdVar41 = pdVar41 + -lVar57;
  }
  if (iVar16 != 1) {
    if (iVar4 < (int)uVar3) {
      pdVar33 = ch + lVar56 * (lVar36 + 3) + lVar21 + 1;
      pdVar12 = c1 + (lVar36 + 3) * lVar29 + lVar25 + 1;
      pdVar13 = ch + lVar56 * (lVar36 + 2) + lVar21 + 1;
      pdVar23 = c1 + (lVar36 + 2) * lVar29 + lVar25 + 1;
      pdVar15 = c1 + lVar29 * (lVar54 + 2) + lVar25 + 1;
      pdVar41 = ch + (lVar54 + 2) * lVar56 + lVar21 + 1;
      pdVar11 = ch + lVar56 * (lVar54 + 3) + lVar21 + 1;
      pdVar14 = c1 + (lVar54 + 3) * lVar29 + lVar25 + 1;
      for (lVar65 = 2; lVar65 <= lVar31; lVar65 = lVar65 + 1) {
        pdVar67 = pdVar33;
        pdVar22 = pdVar41;
        pdVar28 = pdVar11;
        pdVar32 = pdVar14;
        pdVar45 = pdVar23;
        pdVar52 = pdVar12;
        pdVar61 = pdVar13;
        pdVar66 = pdVar15;
        for (lVar40 = 3; lVar40 <= lVar34; lVar40 = lVar40 + 2) {
          lVar54 = 0;
          lVar44 = 0;
          uVar43 = uVar10;
          while (uVar43 = uVar43 - 1, uVar43 != 0) {
            *(double *)((long)pdVar61 + lVar44) =
                 *(double *)((long)pdVar45 + lVar54) - *(double *)((long)pdVar32 + lVar54);
            *(double *)((long)pdVar22 + lVar44) =
                 *(double *)((long)pdVar45 + lVar54) + *(double *)((long)pdVar32 + lVar54);
            *(double *)((long)pdVar67 + lVar44) =
                 *(double *)((long)pdVar52 + lVar54) + *(double *)((long)pdVar66 + lVar54);
            *(double *)((long)pdVar28 + lVar44) =
                 *(double *)((long)pdVar52 + lVar54) - *(double *)((long)pdVar66 + lVar54);
            lVar44 = lVar44 + lVar39;
            lVar54 = lVar54 + lVar59;
          }
          pdVar67 = pdVar67 + lVar56 * 2;
          pdVar52 = pdVar52 + lVar29 * 2;
          pdVar61 = pdVar61 + lVar56 * 2;
          pdVar45 = pdVar45 + lVar29 * 2;
          pdVar66 = pdVar66 + lVar29 * 2;
          pdVar22 = pdVar22 + lVar56 * 2;
          pdVar28 = pdVar28 + lVar56 * 2;
          pdVar32 = pdVar32 + lVar29 * 2;
        }
        pdVar33 = pdVar33 + lVar49;
        pdVar12 = pdVar12 + lVar57;
        pdVar13 = pdVar13 + lVar49;
        pdVar23 = pdVar23 + lVar57;
        pdVar15 = pdVar15 + -lVar57;
        pdVar41 = pdVar41 + -lVar49;
        pdVar11 = pdVar11 + -lVar49;
        pdVar14 = pdVar14 + -lVar57;
      }
    }
    else {
      pdVar12 = ch + lVar56 * (lVar36 + 2) + lVar21 + 1;
      pdVar13 = c1 + (lVar36 + 2) * lVar29 + lVar25 + 1;
      pdVar41 = c1 + lVar29 * (lVar54 + 2) + lVar25 + 1;
      local_1c8 = ch + (lVar54 + 2) * lVar56 + lVar21 + 1;
      local_1b8 = ch + lVar56 * (lVar54 + 3) + lVar21 + 1;
      pdVar11 = c1 + (lVar54 + 3) * lVar29 + lVar25 + 1;
      pdVar33 = ch + lVar56 * (lVar36 + 3) + lVar21 + 1;
      pdVar14 = c1 + (lVar36 + 3) * lVar29 + lVar25 + 1;
      for (lVar65 = 2; lVar65 <= lVar31; lVar65 = lVar65 + 1) {
        pdVar15 = local_1b8;
        pdVar23 = local_1c8;
        pdVar67 = pdVar11;
        pdVar22 = pdVar14;
        pdVar28 = pdVar41;
        pdVar32 = pdVar12;
        pdVar45 = pdVar13;
        pdVar52 = pdVar33;
        for (uVar43 = 1; uVar43 != uVar10; uVar43 = uVar43 + 1) {
          lVar54 = 0;
          lVar44 = 0;
          for (lVar40 = 3; lVar40 <= lVar34; lVar40 = lVar40 + 2) {
            *(double *)((long)pdVar32 + lVar44) =
                 *(double *)((long)pdVar45 + lVar54) - *(double *)((long)pdVar67 + lVar54);
            *(double *)((long)pdVar23 + lVar44) =
                 *(double *)((long)pdVar45 + lVar54) + *(double *)((long)pdVar67 + lVar54);
            *(double *)((long)pdVar52 + lVar44) =
                 *(double *)((long)pdVar22 + lVar54) + *(double *)((long)pdVar28 + lVar54);
            *(double *)((long)pdVar15 + lVar44) =
                 *(double *)((long)pdVar22 + lVar54) - *(double *)((long)pdVar28 + lVar54);
            lVar44 = lVar44 + lVar56 * 0x10;
            lVar54 = lVar54 + lVar29 * 0x10;
          }
          pdVar32 = pdVar32 + lVar38;
          pdVar45 = pdVar45 + lVar27;
          pdVar28 = pdVar28 + lVar27;
          pdVar23 = pdVar23 + lVar38;
          pdVar15 = pdVar15 + lVar38;
          pdVar67 = pdVar67 + lVar27;
          pdVar52 = pdVar52 + lVar38;
          pdVar22 = pdVar22 + lVar27;
        }
        pdVar12 = pdVar12 + lVar49;
        pdVar13 = pdVar13 + lVar57;
        pdVar41 = pdVar41 + -lVar57;
        local_1c8 = local_1c8 + -lVar49;
        local_1b8 = local_1b8 + -lVar49;
        pdVar11 = pdVar11 + -lVar57;
        pdVar33 = pdVar33 + lVar49;
        pdVar14 = pdVar14 + lVar57;
      }
    }
    uVar43 = 0;
    if (0 < *idl1) {
      uVar43 = (ulong)(uint)*idl1;
    }
    pdVar14 = c2 + (lVar7 + 1) * lVar29 + lVar26 + 1;
    pdVar12 = ch2 + lVar60 + lVar8 + 1;
    while (bVar70 = uVar43 != 0, uVar43 = uVar43 - 1, bVar70) {
      *pdVar14 = *pdVar12;
      pdVar14 = pdVar14 + lVar29;
      pdVar12 = pdVar12 + lVar56;
    }
    pdVar14 = c1 + lVar69 + lVar25 + 1;
    pdVar12 = ch + lVar37 + lVar21 + 1;
    for (lVar7 = 2; pdVar41 = pdVar12, pdVar11 = pdVar14, uVar43 = uVar10, lVar7 <= lVar9;
        lVar7 = lVar7 + 1) {
      while (uVar43 - 1 != 0) {
        *pdVar11 = *pdVar41;
        pdVar41 = pdVar41 + lVar38;
        pdVar11 = pdVar11 + lVar27;
        uVar43 = uVar43 - 1;
      }
      pdVar14 = pdVar14 + lVar57;
      pdVar12 = pdVar12 + lVar49;
    }
    if ((int)uVar3 < iVar4) {
      iVar46 = (iVar24 * 2 + 1) * iVar1 + 2;
      iVar24 = iVar30 * iVar46;
      iVar46 = iVar46 * iVar2;
      local_1d8 = c1 + lVar29 * (lVar36 + 3) + lVar25 + 1;
      local_1c8 = ch + (lVar36 + 3) * lVar56 + lVar21 + 1;
      iVar19 = 0;
      for (lVar7 = 2; lVar7 <= lVar9; lVar7 = lVar7 + 1) {
        pdVar14 = local_1d8;
        pdVar12 = local_1c8;
        iVar47 = iVar46;
        iVar4 = iVar24;
        for (uVar43 = 1; uVar43 != uVar10; uVar43 = uVar43 + 1) {
          pdVar41 = pdVar14;
          pdVar11 = pdVar12;
          iVar18 = iVar47;
          iVar42 = iVar4;
          for (lVar8 = 3; lVar8 <= lVar34; lVar8 = lVar8 + 2) {
            c1[lVar25 + (long)iVar42 + 1] =
                 wa[(long)iVar19 + lVar8 + -3] * ch[lVar21 + (long)iVar18 + 1] -
                 *pdVar11 * wa[(long)iVar19 + lVar8 + -2];
            *pdVar41 = wa[(long)iVar19 + lVar8 + -3] * *pdVar11 +
                       wa[(long)iVar19 + lVar8 + -2] * ch[lVar21 + (long)iVar18 + 1];
            iVar42 = iVar42 + iVar30 * 2;
            iVar18 = iVar18 + iVar2 * 2;
            pdVar41 = pdVar41 + lVar29 * 2;
            pdVar11 = pdVar11 + lVar56 * 2;
          }
          iVar4 = iVar4 + iVar30 * iVar1;
          iVar47 = iVar47 + iVar1 * iVar2;
          pdVar14 = pdVar14 + lVar27;
          pdVar12 = pdVar12 + lVar38;
        }
        iVar19 = iVar19 + iVar16;
        iVar24 = iVar24 + iVar30 * (int)lVar20;
        iVar46 = iVar46 + (int)lVar20 * iVar2;
        local_1d8 = local_1d8 + lVar57;
        local_1c8 = local_1c8 + lVar49;
      }
    }
    else {
      pdVar12 = ch + (lVar36 + 3) * lVar56 + lVar21 + 1;
      pdVar14 = ch + (lVar36 + 2) * lVar56 + lVar21 + 1;
      lVar8 = 0;
      iVar30 = 0;
      for (lVar7 = 2; lVar7 <= lVar9; lVar7 = lVar7 + 1) {
        pdVar41 = pdVar14;
        lVar21 = (long)iVar30;
        pdVar11 = pdVar12;
        lVar65 = lVar8;
        for (lVar20 = 3; lVar20 <= lVar34; lVar20 = lVar20 + 2) {
          lVar26 = 0;
          lVar69 = lVar65;
          uVar43 = uVar10;
          while (uVar43 = uVar43 - 1, uVar43 != 0) {
            *(double *)((long)c1 + lVar69 + lVar25 * 8 + lVar29 * (lVar36 + 2) * 8 + 8) =
                 wa[lVar21] * *(double *)((long)pdVar41 + lVar26) -
                 *(double *)((long)pdVar11 + lVar26) * wa[lVar21 + 1];
            *(double *)((long)c1 + lVar69 + lVar25 * 8 + lVar29 * (lVar36 + 3) * 8 + 8) =
                 wa[lVar21] * *(double *)((long)pdVar11 + lVar26) +
                 wa[lVar21 + 1] * *(double *)((long)pdVar41 + lVar26);
            lVar69 = lVar69 + lVar59;
            lVar26 = lVar26 + lVar39;
          }
          lVar65 = lVar65 + lVar29 * 0x10;
          pdVar11 = pdVar11 + lVar56 * 2;
          pdVar41 = pdVar41 + lVar56 * 2;
          lVar21 = lVar21 + 2;
        }
        iVar30 = iVar30 + iVar16;
        lVar8 = lVar8 + lVar57 * 8;
        pdVar12 = pdVar12 + lVar49;
        pdVar14 = pdVar14 + lVar49;
      }
    }
  }
  return 0;
}

Assistant:

int r1fgkb_(int *ido, int *ip, int *l1, int *
	idl1, fft_real_t *cc, fft_real_t *c1, fft_real_t *c2, int *in1, fft_real_t *ch, fft_real_t *ch2,
	 int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, c1_dim1, c1_dim2, c1_dim3, c1_offset, c2_dim1, c2_dim2,
	     c2_offset, ch2_dim1, ch2_dim2, ch2_offset, i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k, l, j2, ic, jc, lc, ik, is;
     fft_real_t dc2, ai1, ai2, ar1, ar2, ds2;
     int nbd;
     fft_real_t dcp, arg, dsp, tpi, ar1h, ar2h;
     int idp2, ipp2, idij, ipph;


    /* Parameter adjustments */
    --wa;
    c2_dim1 = *in1;
    c2_dim2 = *idl1;
    c2_offset = 1 + c2_dim1 * (1 + c2_dim2);
    c2 -= c2_offset;
    c1_dim1 = *in1;
    c1_dim2 = *ido;
    c1_dim3 = *l1;
    c1_offset = 1 + c1_dim1 * (1 + c1_dim2 * (1 + c1_dim3));
    c1 -= c1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch2_dim1 = *in2;
    ch2_dim2 = *idl1;
    ch2_offset = 1 + ch2_dim1 * (1 + ch2_dim2);
    ch2 -= ch2_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    tpi = atan(1.0) * 8.0;
    arg = tpi / (fft_real_t) (*ip);
    dcp = cos(arg);
    dsp = sin(arg);
    idp2 = *ido + 2;
    nbd = (*ido - 1) / 2;
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    if (*ido < *l1) {
	goto L103;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1];
/* L101: */
	}
/* L102: */
    }
    goto L106;
L103:
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1];
/* L104: */
	}
/* L105: */
    }
L106:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[(*ido + (
		    j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] + cc[(*
		    ido + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1];
	    ch[((k + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((j2 -
		    1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((j2
		    - 1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1];
/* L1007: */
/* L107: */
	}
/* L108: */
    }
    if (*ido == 1) {
	goto L116;
    }
    if (nbd < *l1) {
	goto L112;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ic = idp2 - i__;
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] + cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] - cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] - cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] + cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
/* L109: */
	    }
/* L110: */
	}
/* L111: */
    }
    goto L116;
L112:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] + cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] - cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] - cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] + cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
/* L113: */
	    }
/* L114: */
	}
/* L115: */
    }
L116:
    ar1 = 1.0;
    ai1 = 0.0;
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	ar1h = dcp * ar1 - dsp * ai1;
	ai1 = dcp * ai1 + dsp * ar1;
	ar1 = ar1h;
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    c2[(ik + l * c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) *
		    ch2_dim1 + 1] + ar1 * ch2[(ik + (ch2_dim2 << 1)) *
		    ch2_dim1 + 1];
	    c2[(ik + lc * c2_dim2) * c2_dim1 + 1] = ai1 * ch2[(ik + *ip *
		    ch2_dim2) * ch2_dim1 + 1];
/* L117: */
	}
	dc2 = ar1;
	ds2 = ai1;
	ar2 = ar1;
	ai2 = ai1;
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    ar2h = dc2 * ar2 - ds2 * ai2;
	    ai2 = dc2 * ai2 + ds2 * ar2;
	    ar2 = ar2h;
	    i__3 = *idl1;
	    for (ik = 1; ik <= i__3; ++ik) {
		c2[(ik + l * c2_dim2) * c2_dim1 + 1] += ar2 * ch2[(ik + j *
			ch2_dim2) * ch2_dim1 + 1];
		c2[(ik + lc * c2_dim2) * c2_dim1 + 1] += ai2 * ch2[(ik + jc *
			ch2_dim2) * ch2_dim1 + 1];
/* L118: */
	    }
/* L119: */
	}
/* L120: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + ch2_dim2) * ch2_dim1 + 1] += ch2[(ik + j * ch2_dim2) *
		    ch2_dim1 + 1];
/* L121: */
	}
/* L122: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j *
		     c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] - c1[((k + jc *
		    c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
	    ch[((k + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j
		    * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] + c1[((k + jc *
		    c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
/* L123: */
	}
/* L124: */
    }
    if (*ido == 1) {
	goto L132;
    }
    if (nbd < *l1) {
	goto L128;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] - c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] + c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] +
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] -
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
/* L125: */
	    }
/* L126: */
	}
/* L127: */
    }
    goto L132;
L128:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] - c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] + c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] +
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] -
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
/* L129: */
	    }
/* L130: */
	}
/* L131: */
    }
L132:
    if (*ido == 1) {
	return 0;
    }
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	c2[(ik + c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) * ch2_dim1 + 1]
		;
/* L133: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    c1[((k + j * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L134: */
	}
/* L135: */
    }
    if (nbd > *l1) {
	goto L139;
    }
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	idij = is;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    idij += 2;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			wa[idij - 1] * ch[(i__ - 1 + (k + j * ch_dim3) *
			ch_dim2) * ch_dim1 + 1] - wa[idij] * ch[(i__ + (k + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = wa[
			idij - 1] * ch[(i__ + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + wa[idij] * ch[(i__ - 1 + (k + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L136: */
	    }
/* L137: */
	}
/* L138: */
    }
    goto L143;
L139:
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    idij = is;
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		idij += 2;
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			wa[idij - 1] * ch[(i__ - 1 + (k + j * ch_dim3) *
			ch_dim2) * ch_dim1 + 1] - wa[idij] * ch[(i__ + (k + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = wa[
			idij - 1] * ch[(i__ + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + wa[idij] * ch[(i__ - 1 + (k + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L140: */
	    }
/* L141: */
	}
/* L142: */
    }
L143:
    return 0;
}